

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O2

PcodeOp * Funcdata::findPrimaryBranch
                    (const_iterator iter,const_iterator enditer,bool findbranch,bool findcall,
                    bool findreturn)

{
  PcodeOp *pPVar1;
  
  do {
    if (iter._M_node == enditer._M_node) {
      return (PcodeOp *)0x0;
    }
    pPVar1 = (PcodeOp *)iter._M_node[1]._M_right;
    switch(pPVar1->opcode->opcode) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if ((findbranch) &&
         (((*(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start)->flags & 2) == 0)) {
        return pPVar1;
      }
      break;
    case CPUI_BRANCHIND:
      if (findbranch) {
        return pPVar1;
      }
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall) {
        return pPVar1;
      }
      break;
    case CPUI_RETURN:
      if (findreturn) {
        return pPVar1;
      }
    }
    iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
  } while( true );
}

Assistant:

PcodeOp *Funcdata::findPrimaryBranch(PcodeOpTree::const_iterator iter,PcodeOpTree::const_iterator enditer,
				     bool findbranch,bool findcall,bool findreturn)
{
  while(iter != enditer) {
    PcodeOp *op = (*iter).second;
    switch(op->code()) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if (findbranch) {
	if (!op->getIn(0)->isConstant()) // Make sure this is not an internal branch
	  return op;
      }
      break;
    case CPUI_BRANCHIND:
      if (findbranch)
	return op;
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall)
	return op;
      break;
    case CPUI_RETURN:
      if (findreturn)
	return op;
      break;
    default:
      break;
    }
    ++iter;
  }
  return (PcodeOp *)0;
}